

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

void Dtc_ManPrintFadds(Vec_Int_t *vFadds)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  if (4 < vFadds->nSize) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      printf("%6d : ",uVar3 & 0xffffffff);
      iVar1 = (int)lVar2;
      if (vFadds->nSize <= iVar1) {
LAB_005e09d8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      printf("%6d ",(ulong)(uint)vFadds->pArray[lVar2]);
      if (vFadds->nSize <= iVar1 + 1) goto LAB_005e09d8;
      printf("%6d ",(ulong)(uint)vFadds->pArray[lVar2 + 1]);
      if (vFadds->nSize <= iVar1 + 2) goto LAB_005e09d8;
      printf("%6d ",(ulong)(uint)vFadds->pArray[lVar2 + 2]);
      printf(" ->  ");
      if (vFadds->nSize <= iVar1 + 3) goto LAB_005e09d8;
      printf("%6d ",(ulong)(uint)vFadds->pArray[lVar2 + 3]);
      if (vFadds->nSize <= iVar1 + 4) goto LAB_005e09d8;
      printf("%6d ",(ulong)(uint)vFadds->pArray[lVar2 + 4]);
      putchar(10);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 5;
    } while ((long)uVar3 < (long)(vFadds->nSize / 5));
  }
  return;
}

Assistant:

void Dtc_ManPrintFadds( Vec_Int_t * vFadds )
{
    int i;
    Dtc_ForEachFadd( vFadds, i )
    {
        printf( "%6d : ", i );
        printf( "%6d ", Vec_IntEntry(vFadds, 5*i+0) );
        printf( "%6d ", Vec_IntEntry(vFadds, 5*i+1) );
        printf( "%6d ", Vec_IntEntry(vFadds, 5*i+2) );
        printf( " ->  " );
        printf( "%6d ", Vec_IntEntry(vFadds, 5*i+3) );
        printf( "%6d ", Vec_IntEntry(vFadds, 5*i+4) );
        printf( "\n" );
    }
}